

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__jpeg_finish(stbi__jpeg *z)

{
  int iVar1;
  int iVar2;
  short *data_00;
  short *data;
  int h;
  int w;
  int n;
  int j;
  int i;
  stbi__jpeg *z_local;
  
  if (z->progressive != 0) {
    for (h = 0; h < z->s->img_n; h = h + 1) {
      iVar1 = z->img_comp[h].x;
      iVar2 = z->img_comp[h].y;
      for (w = 0; w < iVar2 + 7 >> 3; w = w + 1) {
        for (n = 0; n < iVar1 + 7 >> 3; n = n + 1) {
          data_00 = z->img_comp[h].coeff + (n + w * z->img_comp[h].coeff_w) * 0x40;
          stbi__jpeg_dequantize(data_00,z->dequant[z->img_comp[h].tq]);
          (*z->idct_block_kernel)
                    (z->img_comp[h].data + (long)(n << 3) + (long)(z->img_comp[h].w2 * w * 8),
                     z->img_comp[h].w2,data_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void stbi__jpeg_finish(stbi__jpeg *z)
{
    if (z->progressive)
    {
        // dequantize and idct the data
        int i, j, n;
        for (n = 0; n < z->s->img_n; ++n)
        {
            int w = (z->img_comp[n].x + 7) >> 3;
            int h = (z->img_comp[n].y + 7) >> 3;
            for (j = 0; j < h; ++j)
            {
                for (i = 0; i < w; ++i)
                {
                    short *data = z->img_comp[n].coeff + 64 * (i + j * z->img_comp[n].coeff_w);
                    stbi__jpeg_dequantize(data, z->dequant[z->img_comp[n].tq]);
                    z->idct_block_kernel(z->img_comp[n].data + z->img_comp[n].w2 * j * 8 + i * 8, z->img_comp[n].w2,
                                         data);
                }
            }
        }
    }
}